

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_scalar_shift_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  uint32_t rd_00;
  uint32_t rn_00;
  uint32_t opcode_00;
  uint32_t immb_00;
  uint32_t immh_00;
  uint32_t uVar1;
  bool is_u_00;
  _Bool is_u;
  int immh;
  int immb;
  int opcode;
  int rn;
  int rd;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  rd_00 = extract32(insn,0,5);
  rn_00 = extract32(insn,5,5);
  opcode_00 = extract32(insn,0xb,5);
  immb_00 = extract32(insn,0x10,3);
  immh_00 = extract32(insn,0x13,4);
  uVar1 = extract32(insn,0x1d,1);
  is_u_00 = uVar1 != 0;
  if (immh_00 == 0) {
    unallocated_encoding_aarch64(s);
  }
  else {
    switch(opcode_00) {
    default:
      unallocated_encoding_aarch64(s);
      break;
    case 8:
      if (!is_u_00) {
        unallocated_encoding_aarch64(s);
        return;
      }
    case 0:
    case 2:
    case 4:
    case 6:
      handle_scalar_simd_shri(s,is_u_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
      break;
    case 10:
      handle_scalar_simd_shli(s,is_u_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
      break;
    case 0xc:
      if (is_u_00) {
        handle_simd_qshl(s,true,false,false,true,immh_00,immb_00,rn_00,rd_00);
      }
      else {
        unallocated_encoding_aarch64(s);
      }
      break;
    case 0xe:
      handle_simd_qshl(s,true,false,is_u_00,is_u_00,immh_00,immb_00,rn_00,rd_00);
      break;
    case 0x10:
    case 0x11:
      if (is_u_00) {
        handle_vec_simd_sqshrn(s,true,false,false,true,immh_00,immb_00,opcode_00,rn_00,rd_00);
      }
      else {
        unallocated_encoding_aarch64(s);
      }
      break;
    case 0x12:
    case 0x13:
      handle_vec_simd_sqshrn(s,true,false,is_u_00,is_u_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
      break;
    case 0x1c:
      handle_simd_shift_intfp_conv(s,true,false,is_u_00,immh_00,immb_00,opcode_00,rn_00,rd_00);
      break;
    case 0x1f:
      handle_simd_shift_fpint_conv(s,true,false,is_u_00,immh_00,immb_00,rn_00,rd_00);
    }
  }
  return;
}

Assistant:

static void disas_simd_scalar_shift_imm(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 5);
    int immb = extract32(insn, 16, 3);
    int immh = extract32(insn, 19, 4);
    bool is_u = extract32(insn, 29, 1);

    if (immh == 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0x08: /* SRI */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x00: /* SSHR / USHR */
    case 0x02: /* SSRA / USRA */
    case 0x04: /* SRSHR / URSHR */
    case 0x06: /* SRSRA / URSRA */
        handle_scalar_simd_shri(s, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x0a: /* SHL / SLI */
        handle_scalar_simd_shli(s, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x1c: /* SCVTF, UCVTF */
        handle_simd_shift_intfp_conv(s, true, false, is_u, immh, immb,
                                     opcode, rn, rd);
        break;
    case 0x10: /* SQSHRUN, SQSHRUN2 */
    case 0x11: /* SQRSHRUN, SQRSHRUN2 */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_vec_simd_sqshrn(s, true, false, false, true,
                               immh, immb, opcode, rn, rd);
        break;
    case 0x12: /* SQSHRN, SQSHRN2, UQSHRN */
    case 0x13: /* SQRSHRN, SQRSHRN2, UQRSHRN, UQRSHRN2 */
        handle_vec_simd_sqshrn(s, true, false, is_u, is_u,
                               immh, immb, opcode, rn, rd);
        break;
    case 0xc: /* SQSHLU */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_simd_qshl(s, true, false, false, true, immh, immb, rn, rd);
        break;
    case 0xe: /* SQSHL, UQSHL */
        handle_simd_qshl(s, true, false, is_u, is_u, immh, immb, rn, rd);
        break;
    case 0x1f: /* FCVTZS, FCVTZU */
        handle_simd_shift_fpint_conv(s, true, false, is_u, immh, immb, rn, rd);
        break;
    default:
        unallocated_encoding(s);
        break;
    }
}